

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O0

int TeleportFeed(int stream,float *samples,int numsamples)

{
  SharedMemoryHandle *this;
  SharedMemory *pSVar1;
  int local_2c;
  int n;
  Stream *s;
  int numsamples_local;
  float *samples_local;
  int stream_local;
  
  this = Teleport::GetSharedMemory();
  pSVar1 = Teleport::SharedMemoryHandle::operator->(this);
  for (local_2c = 0; local_2c < numsamples; local_2c = local_2c + 1) {
    Teleport::Stream::Feed(pSVar1->streams + stream,samples[local_2c]);
  }
  return pSVar1->streams[stream].writepos;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportFeed(int stream, float* samples, int numsamples)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    for (int n = 0; n < numsamples; n++)
        s.Feed(samples[n]);
    return s.writepos;
}